

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O3

uchar * runfind(uchar *lst,runsdef *item)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  byte *pbVar4;
  int iVar5;
  
  iVar5 = *(ushort *)lst - 2;
  if (iVar5 != 0) {
    pbVar4 = lst + 2;
    do {
      bVar1 = *pbVar4;
      if (bVar1 == item->runstyp) {
        switch(bVar1) {
        case 1:
          if ((item->runsv).runsvnum == (long)*(int *)(pbVar4 + 1)) {
            return pbVar4;
          }
          break;
        case 2:
        case 10:
        case 0xd:
          if (*(objnum *)(pbVar4 + 1) == (item->runsv).runsvobj) {
            return pbVar4;
          }
          break;
        case 3:
        case 7:
          if ((*(ushort *)(pbVar4 + 1) == *(ushort *)(item->runsv).runsvstr) &&
             (iVar2 = bcmp(pbVar4 + 1,(item->runsv).runsvstr,(ulong)*(ushort *)(pbVar4 + 1)),
             iVar2 == 0)) {
            return pbVar4;
          }
          break;
        case 5:
        case 8:
          goto switchD_00135e16_caseD_5;
        }
      }
      uVar3 = datsiz((uint)bVar1,pbVar4 + 1);
      pbVar4 = pbVar4 + (uVar3 + 1);
      iVar5 = iVar5 - (uVar3 + 1);
    } while (iVar5 != 0);
  }
  pbVar4 = (byte *)0x0;
switchD_00135e16_caseD_5:
  return pbVar4;
}

Assistant:

uchar *runfind(uchar *lst, runsdef *item)
{
    uint len;
    uint curlen;
    
    for (len = osrp2(lst) - 2, lst += 2 ; len ; lst += curlen, len -= curlen)
    {
        if (*lst == item->runstyp)
        {
            switch(*lst)
            {
            case DAT_LIST:
            case DAT_SSTRING:
                if (osrp2(lst+1) == osrp2(item->runsv.runsvstr) &&
                   !memcmp(lst+1, item->runsv.runsvstr, (size_t)osrp2(lst+1)))
                    return(lst);
                break;
            case DAT_NUMBER:
                if (osrp4s(lst+1) == item->runsv.runsvnum)
                    return(lst);
                break;

            case DAT_TRUE:
            case DAT_NIL:
                return(lst);

            case DAT_OBJECT:
            case DAT_FNADDR:
                if (osrp2(lst+1) == item->runsv.runsvobj)
                    return(lst);
                break;

            case DAT_PROPNUM:
                if (osrp2(lst+1) == item->runsv.runsvprp)
                    return(lst);
                break;
            }
        }
        curlen = datsiz(*lst, lst+1) + 1;
    }
    return((uchar *)0);
}